

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O3

void duckdb::HandleRename
               (StarExpression *expr,QualifiedColumnName *qualified_name,ParsedExpression *new_expr)

{
  iterator iVar1;
  
  iVar1 = ::std::
          _Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(expr->rename_list)._M_h,qualified_name);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    ::std::__cxx11::string::_M_assign((string *)&(new_expr->super_BaseExpression).alias);
    return;
  }
  return;
}

Assistant:

void HandleRename(StarExpression &expr, const QualifiedColumnName &qualified_name, ParsedExpression &new_expr) {
	auto rename_entry = expr.rename_list.find(qualified_name);
	if (rename_entry != expr.rename_list.end()) {
		new_expr.SetAlias(rename_entry->second);
	}
}